

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TessPrimitiveType primType,
          bool usePointMode)

{
  pointer pcVar1;
  undefined8 uVar2;
  long *plVar3;
  string *psVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  psVar4 = (string *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  paVar6 = &psVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar6) {
    uVar2 = *(undefined8 *)((long)&psVar4->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = psVar4->_M_string_length;
  (psVar4->_M_dataplus)._M_p = (pointer)paVar6;
  psVar4->_M_string_length = 0;
  (psVar4->field_2)._M_local_buf[0] = '\0';
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
    psVar4 = extraout_RAX;
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
    psVar4 = extraout_RAX_00;
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
    psVar4 = extraout_RAX_01;
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    psVar4 = extraout_RAX_02;
  }
  return psVar4;
}

Assistant:

static inline string getTessellationEvaluationInLayoutString (TessPrimitiveType primType, bool usePointMode=false)
{
	return string() + "layout (" + getTessPrimitiveTypeShaderName(primType)
								 + (usePointMode ? ", point_mode" : "")
								 + ") in;\n";
}